

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleMesh.cpp
# Opt level: O2

int __thiscall
btTriangleMesh::findOrAddVertex(btTriangleMesh *this,btVector3 *vertex,bool removeDuplicateVertices)

{
  int *piVar1;
  btAlignedObjectArray<float> *this_00;
  float *pfVar2;
  btIndexedMesh *pbVar3;
  int iVar4;
  int i_1;
  long lVar5;
  int i;
  ulong uVar6;
  btScalar bVar7;
  btVector3 vtx;
  btVector3 local_40;
  
  if (this->m_use4componentVertices == true) {
    if (removeDuplicateVertices) {
      lVar5 = 0;
      for (uVar6 = 0; (long)uVar6 < (long)(this->m_4componentVertices).m_size; uVar6 = uVar6 + 1) {
        vtx = operator-((btVector3 *)((long)((this->m_4componentVertices).m_data)->m_floats + lVar5)
                        ,vertex);
        bVar7 = btVector3::length2(&vtx);
        if (bVar7 <= this->m_weldingThreshold) goto LAB_00158b25;
        lVar5 = lVar5 + 0x10;
      }
    }
    piVar1 = &((this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_data)->m_numVertices;
    *piVar1 = *piVar1 + 1;
    btAlignedObjectArray<btVector3>::push_back(&this->m_4componentVertices,vertex);
    ((this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_data)->m_vertexBase =
         (uchar *)(this->m_4componentVertices).m_data;
    iVar4 = (this->m_4componentVertices).m_size;
  }
  else {
    if (removeDuplicateVertices) {
      uVar6 = 0;
      for (lVar5 = 0; lVar5 < (this->m_3componentVertices).m_size; lVar5 = lVar5 + 3) {
        pfVar2 = (this->m_3componentVertices).m_data;
        vtx.m_floats[1] = pfVar2[lVar5 + 1];
        vtx.m_floats[0] = pfVar2[lVar5];
        vtx.m_floats[2] = pfVar2[lVar5 + 2];
        vtx.m_floats[3] = 0.0;
        local_40 = operator-(&vtx,vertex);
        bVar7 = btVector3::length2(&local_40);
        if (bVar7 <= this->m_weldingThreshold) goto LAB_00158b25;
        uVar6 = (ulong)((int)uVar6 + 1);
      }
    }
    this_00 = &this->m_3componentVertices;
    btAlignedObjectArray<float>::push_back(this_00,vertex->m_floats);
    btAlignedObjectArray<float>::push_back(this_00,vertex->m_floats + 1);
    btAlignedObjectArray<float>::push_back(this_00,vertex->m_floats + 2);
    pbVar3 = (this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_data;
    piVar1 = &pbVar3->m_numVertices;
    *piVar1 = *piVar1 + 1;
    pbVar3->m_vertexBase = (uchar *)(this->m_3componentVertices).m_data;
    iVar4 = (this->m_3componentVertices).m_size / 3;
  }
  uVar6 = (ulong)(iVar4 - 1);
LAB_00158b25:
  return (int)uVar6;
}

Assistant:

int	btTriangleMesh::findOrAddVertex(const btVector3& vertex, bool removeDuplicateVertices)
{
	//return index of new/existing vertex
	///@todo: could use acceleration structure for this
	if (m_use4componentVertices)
	{
		if (removeDuplicateVertices)
			{
			for (int i=0;i< m_4componentVertices.size();i++)
			{
				if ((m_4componentVertices[i]-vertex).length2() <= m_weldingThreshold)
				{
					return i;
				}
			}
		}
		m_indexedMeshes[0].m_numVertices++;
		m_4componentVertices.push_back(vertex);
		m_indexedMeshes[0].m_vertexBase = (unsigned char*)&m_4componentVertices[0];

		return m_4componentVertices.size()-1;
		
	} else
	{
		
		if (removeDuplicateVertices)
		{
			for (int i=0;i< m_3componentVertices.size();i+=3)
			{
				btVector3 vtx(m_3componentVertices[i],m_3componentVertices[i+1],m_3componentVertices[i+2]);
				if ((vtx-vertex).length2() <= m_weldingThreshold)
				{
					return i/3;
				}
			}
		}
		m_3componentVertices.push_back(vertex.getX());
		m_3componentVertices.push_back(vertex.getY());
		m_3componentVertices.push_back(vertex.getZ());
		m_indexedMeshes[0].m_numVertices++;
		m_indexedMeshes[0].m_vertexBase = (unsigned char*)&m_3componentVertices[0];
		return (m_3componentVertices.size()/3)-1;
	}

}